

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSImporter::SkipTCBInfo(Discreet3DSImporter *this)

{
  ushort uVar1;
  Logger *this_00;
  
  uVar1 = StreamReader<false,_false>::Get<short>(this->stream);
  if (uVar1 == 0) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"3DS: Skipping TCB animation info");
    return;
  }
  if ((uVar1 & 1) != 0) {
    StreamReader<false,_false>::IncPtr(this->stream,4);
  }
  if ((uVar1 & 4) != 0) {
    StreamReader<false,_false>::IncPtr(this->stream,4);
  }
  if ((uVar1 & 2) != 0) {
    StreamReader<false,_false>::IncPtr(this->stream,4);
  }
  if ((uVar1 & 0x10) != 0) {
    StreamReader<false,_false>::IncPtr(this->stream,4);
  }
  if ((uVar1 & 8) == 0) {
    return;
  }
  StreamReader<false,_false>::IncPtr(this->stream,4);
  return;
}

Assistant:

void Discreet3DSImporter::SkipTCBInfo()
{
    unsigned int flags = stream->GetI2();

    if (!flags) {
        // Currently we can't do anything with these values. They occur
        // quite rare, so it wouldn't be worth the effort implementing
        // them. 3DS is not really suitable for complex animations,
        // so full support is not required.
        ASSIMP_LOG_WARN("3DS: Skipping TCB animation info");
    }

    if (flags & Discreet3DS::KEY_USE_TENS) {
        stream->IncPtr(4);
    }
    if (flags & Discreet3DS::KEY_USE_BIAS) {
        stream->IncPtr(4);
    }
    if (flags & Discreet3DS::KEY_USE_CONT) {
        stream->IncPtr(4);
    }
    if (flags & Discreet3DS::KEY_USE_EASE_FROM) {
        stream->IncPtr(4);
    }
    if (flags & Discreet3DS::KEY_USE_EASE_TO) {
        stream->IncPtr(4);
    }
}